

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O2

Name __thiscall
wasm::Names::getValidName
          (Names *this,Name root,function<bool_(wasm::Name)> *check,Index hint,string *separator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  IString IVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 in_register_00000084;
  Name __args;
  string local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefixed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  undefined1 auStack_58 [8];
  Name root_local;
  char *pcStack_40;
  
  root_local.super_IString.str._M_len = root.super_IString.str._M_len;
  uVar3 = (ulong)check & 0xffffffff;
  __args.super_IString.str._M_str = (char *)root_local.super_IString.str._M_len;
  __args.super_IString.str._M_len = (size_t)this;
  auStack_58 = (undefined1  [8])this;
  bVar2 = std::function<bool_(wasm::Name)>::operator()(root.super_IString.str._M_str,__args);
  if (bVar2) {
    root_local.super_IString.str._M_str = (char *)auStack_58;
    pcStack_40 = (char *)root_local.super_IString.str._M_len;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)(prefixed.field_2._M_local_buf + 8),
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (allocator<char> *)&local_c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&prefixed.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000084,hint));
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (&prefixed.field_2._M_allocated_capacity + 1);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    do {
      std::__cxx11::to_string(&local_c8,(uint)uVar3);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     &local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      IString::IString((IString *)((long)&name.field_2 + 8),__return_storage_ptr__);
      bVar2 = std::function<bool_(wasm::Name)>::operator()
                        (root.super_IString.str._M_str,(Name)stack0xffffffffffffff98);
      if (bVar2) {
        IString::IString((IString *)&root_local.super_IString.str._M_str,__return_storage_ptr__);
      }
      else {
        uVar3 = (ulong)((uint)uVar3 + 1);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    } while (!bVar2);
    std::__cxx11::string::~string((string *)local_a8);
  }
  IVar1.str._M_str = pcStack_40;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidName(Name root,
                         std::function<bool(Name)> check,
                         Index hint = 0,
                         std::string separator = "_") {
  if (check(root)) {
    return root;
  }
  auto prefixed = std::string(root.str) + separator;
  Index num = hint;
  while (1) {
    auto name = prefixed + std::to_string(num);
    if (check(name)) {
      return name;
    }
    num++;
  }
}